

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_get_assignment
               (event *event,event_base **base_out,int *fd_out,short *events_out,
               event_callback_fn *callback_out,void **arg_out)

{
  event_debug_assert_is_setup_(event);
  if (base_out != (event_base **)0x0) {
    *base_out = event->ev_base;
  }
  if (fd_out != (int *)0x0) {
    *fd_out = event->ev_fd;
  }
  if (events_out != (short *)0x0) {
    *events_out = event->ev_events;
  }
  if (callback_out != (event_callback_fn *)0x0) {
    *callback_out = (event_callback_fn)(event->ev_evcallback).evcb_cb_union;
  }
  if (arg_out != (void **)0x0) {
    *arg_out = (event->ev_evcallback).evcb_arg;
  }
  return;
}

Assistant:

void
event_get_assignment(const struct event *event, struct event_base **base_out, evutil_socket_t *fd_out, short *events_out, event_callback_fn *callback_out, void **arg_out)
{
	event_debug_assert_is_setup_(event);

	if (base_out)
		*base_out = event->ev_base;
	if (fd_out)
		*fd_out = event->ev_fd;
	if (events_out)
		*events_out = event->ev_events;
	if (callback_out)
		*callback_out = event->ev_callback;
	if (arg_out)
		*arg_out = event->ev_arg;
}